

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_13::NameResolver::ResolveLocalVar(NameResolver *this,Var *var)

{
  Index index;
  string *psVar1;
  
  if ((var->type_ == Name) && (this->current_func_ != (Func *)0x0)) {
    index = Func::GetLocalIndex(this->current_func_,var);
    if (index != 0xffffffff) {
      Var::set_index(var,index);
      return;
    }
    psVar1 = Var::name_abi_cxx11_(var);
    PrintError(this,&var->loc,"undefined local variable \"%s\"",(psVar1->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

void NameResolver::ResolveLocalVar(Var* var) {
  if (var->is_name()) {
    if (!current_func_) {
      return;
    }

    Index index = current_func_->GetLocalIndex(*var);
    if (index == kInvalidIndex) {
      PrintError(&var->loc, "undefined local variable \"%s\"",
                 var->name().c_str());
      return;
    }

    var->set_index(index);
  }
}